

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Initialize(ImGuiContext *context)

{
  ImGuiViewportP *this;
  ImGuiViewportP **ppIVar1;
  ImVector<ImGuiViewport_*> *this_00;
  undefined1 *in_RDI;
  ImGuiViewportP *viewport;
  ImGuiSettingsHandler ini_handler;
  ImGuiContext *g;
  ImGuiSettingsHandler *in_stack_ffffffffffffff68;
  ImVector<ImGuiSettingsHandler> *in_stack_ffffffffffffff70;
  code *ctx;
  
  ImGuiSettingsHandler::ImGuiSettingsHandler((ImGuiSettingsHandler *)0x1a856e);
  ImHashStr("Window",0,0);
  ctx = WindowSettingsHandler_ReadOpen;
  ImVector<ImGuiSettingsHandler>::push_back(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  MemAlloc((size_t)in_stack_ffffffffffffff70);
  this = (ImGuiViewportP *)operator_new(0x110);
  ImGuiViewportP::ImGuiViewportP(this);
  (this->super_ImGuiViewport).ID = 0x11111111;
  *(undefined4 *)&(this->super_ImGuiViewport).field_0x54 = 0;
  this->PlatformWindowCreated = true;
  ImVector<ImGuiViewportP_*>::push_back
            ((ImVector<ImGuiViewportP_*> *)in_stack_ffffffffffffff70,
             (ImGuiViewportP **)in_stack_ffffffffffffff68);
  ppIVar1 = ImVector<ImGuiViewportP_*>::operator[]
                      ((ImVector<ImGuiViewportP_*> *)(in_RDI + 0x1cb8),0);
  *(ImGuiViewportP **)(in_RDI + 0x1628) = *ppIVar1;
  this_00 = (ImVector<ImGuiViewport_*> *)(in_RDI + 0x1630);
  ImVector<ImGuiViewportP_*>::operator[]((ImVector<ImGuiViewportP_*> *)(in_RDI + 0x1cb8),0);
  ImVector<ImGuiViewport_*>::push_back(this_00,(ImGuiViewport **)in_stack_ffffffffffffff68);
  DockContextInitialize((ImGuiContext *)ctx);
  *in_RDI = 1;
  return;
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }

#ifdef IMGUI_HAS_TABLE
    // Add .ini handle for ImGuiTable type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Table";
        ini_handler.TypeHash = ImHashStr("Table");
        ini_handler.ReadOpenFn = TableSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = TableSettingsHandler_ReadLine;
        ini_handler.WriteAllFn = TableSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    viewport->ID = IMGUI_VIEWPORT_DEFAULT_ID;
    viewport->Idx = 0;
    viewport->PlatformWindowCreated = true;
    g.Viewports.push_back(viewport);
    g.PlatformIO.MainViewport = g.Viewports[0]; // Make it accessible in public-facing GetPlatformIO() immediately (before the first call to EndFrame)
    g.PlatformIO.Viewports.push_back(g.Viewports[0]);

    // Extensions
    IM_ASSERT(g.DockContext == NULL);
    DockContextInitialize(&g);
#endif // #ifdef IMGUI_HAS_DOCK

    g.Initialized = true;
}